

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seg_helper.c
# Opt level: O0

void tss_load_seg(CPUX86State *env,int seg_reg,int selector,int cpl,uintptr_t retaddr)

{
  uint selector_00;
  int seg_reg_00;
  CPUX86State *env_00;
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint32_t uVar4;
  int dpl;
  int rpl;
  uint32_t e2;
  uint32_t e1;
  uintptr_t retaddr_local;
  uint local_18;
  int cpl_local;
  int selector_local;
  int seg_reg_local;
  CPUX86State *env_local;
  
  _e2 = retaddr;
  retaddr_local._4_4_ = cpl;
  local_18 = selector;
  cpl_local = seg_reg;
  _selector_local = env;
  if ((selector & 0xfffcU) == 0) {
    if ((seg_reg == 2) || (seg_reg == 1)) {
      raise_exception_err_ra_x86_64(env,10,selector & 0xfffc,retaddr);
    }
  }
  else {
    iVar1 = load_segment_ra(env,(uint32_t *)&rpl,(uint32_t *)&dpl,selector,retaddr);
    env_00 = _selector_local;
    seg_reg_00 = cpl_local;
    selector_00 = local_18;
    if (iVar1 != 0) {
      raise_exception_err_ra_x86_64(_selector_local,10,local_18 & 0xfffc,_e2);
    }
    if ((dpl & 0x1000U) == 0) {
      raise_exception_err_ra_x86_64(_selector_local,10,local_18 & 0xfffc,_e2);
    }
    uVar2 = local_18 & 3;
    uVar3 = (uint)dpl >> 0xd & 3;
    if (cpl_local == 1) {
      if ((dpl & 0x800U) == 0) {
        raise_exception_err_ra_x86_64(_selector_local,10,local_18 & 0xfffc,_e2);
      }
      if (uVar3 != uVar2) {
        raise_exception_err_ra_x86_64(_selector_local,10,local_18 & 0xfffc,_e2);
      }
    }
    else if (cpl_local == 2) {
      if (((dpl & 0x800U) != 0) || ((dpl & 0x200U) == 0)) {
        raise_exception_err_ra_x86_64(_selector_local,10,local_18 & 0xfffc,_e2);
      }
      if ((uVar3 != retaddr_local._4_4_) || (uVar3 != uVar2)) {
        raise_exception_err_ra_x86_64(_selector_local,10,local_18 & 0xfffc,_e2);
      }
    }
    else {
      if (((dpl & 0x800U) != 0) && ((dpl & 0x200U) == 0)) {
        raise_exception_err_ra_x86_64(_selector_local,10,local_18 & 0xfffc,_e2);
      }
      if ((((uint)dpl >> 8 & 0xf) < 0xc) &&
         (((int)uVar3 < (int)retaddr_local._4_4_ || (uVar3 < uVar2)))) {
        raise_exception_err_ra_x86_64(_selector_local,10,local_18 & 0xfffc,_e2);
      }
    }
    if ((dpl & 0x8000U) == 0) {
      raise_exception_err_ra_x86_64(_selector_local,0xb,local_18 & 0xfffc,_e2);
    }
    uVar4 = get_seg_base(rpl,dpl);
    uVar2 = get_seg_limit(rpl,dpl);
    cpu_x86_load_seg_cache(env_00,seg_reg_00,selector_00,(ulong)uVar4,uVar2,dpl);
  }
  return;
}

Assistant:

static void tss_load_seg(CPUX86State *env, int seg_reg, int selector, int cpl,
                         uintptr_t retaddr)
{
    uint32_t e1, e2;
    int rpl, dpl;

    if ((selector & 0xfffc) != 0) {
        if (load_segment_ra(env, &e1, &e2, selector, retaddr) != 0) {
            raise_exception_err_ra(env, EXCP0A_TSS, selector & 0xfffc, retaddr);
        }
        if (!(e2 & DESC_S_MASK)) {
            raise_exception_err_ra(env, EXCP0A_TSS, selector & 0xfffc, retaddr);
        }
        rpl = selector & 3;
        dpl = (e2 >> DESC_DPL_SHIFT) & 3;
        if (seg_reg == R_CS) {
            if (!(e2 & DESC_CS_MASK)) {
                raise_exception_err_ra(env, EXCP0A_TSS, selector & 0xfffc, retaddr);
            }
            if (dpl != rpl) {
                raise_exception_err_ra(env, EXCP0A_TSS, selector & 0xfffc, retaddr);
            }
        } else if (seg_reg == R_SS) {
            /* SS must be writable data */
            if ((e2 & DESC_CS_MASK) || !(e2 & DESC_W_MASK)) {
                raise_exception_err_ra(env, EXCP0A_TSS, selector & 0xfffc, retaddr);
            }
            if (dpl != cpl || dpl != rpl) {
                raise_exception_err_ra(env, EXCP0A_TSS, selector & 0xfffc, retaddr);
            }
        } else {
            /* not readable code */
            if ((e2 & DESC_CS_MASK) && !(e2 & DESC_R_MASK)) {
                raise_exception_err_ra(env, EXCP0A_TSS, selector & 0xfffc, retaddr);
            }
            /* if data or non conforming code, checks the rights */
            if (((e2 >> DESC_TYPE_SHIFT) & 0xf) < 12) {
                if (dpl < cpl || dpl < rpl) {
                    raise_exception_err_ra(env, EXCP0A_TSS, selector & 0xfffc, retaddr);
                }
            }
        }
        if (!(e2 & DESC_P_MASK)) {
            raise_exception_err_ra(env, EXCP0B_NOSEG, selector & 0xfffc, retaddr);
        }
        cpu_x86_load_seg_cache(env, seg_reg, selector,
                               get_seg_base(e1, e2),
                               get_seg_limit(e1, e2),
                               e2);
    } else {
        if (seg_reg == R_SS || seg_reg == R_CS) {
            raise_exception_err_ra(env, EXCP0A_TSS, selector & 0xfffc, retaddr);
        }
    }
}